

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O2

FT_Pointer ft_service_list_lookup(FT_ServiceDesc service_descriptors,char *service_id)

{
  int iVar1;
  void **ppvVar2;
  
  if (service_id != (char *)0x0 && service_descriptors != (FT_ServiceDesc)0x0) {
    for (ppvVar2 = &service_descriptors->serv_data;
        ((FT_ServiceDescRec *)(ppvVar2 + -1))->serv_id != (char *)0x0; ppvVar2 = ppvVar2 + 2) {
      iVar1 = strcmp(((FT_ServiceDescRec *)(ppvVar2 + -1))->serv_id,service_id);
      if (iVar1 == 0) {
        return *ppvVar2;
      }
    }
  }
  return (FT_Pointer)0x0;
}

Assistant:

FT_BASE_DEF( FT_Pointer )
  ft_service_list_lookup( FT_ServiceDesc  service_descriptors,
                          const char*     service_id )
  {
    FT_Pointer      result = NULL;
    FT_ServiceDesc  desc   = service_descriptors;


    if ( desc && service_id )
    {
      for ( ; desc->serv_id != NULL; desc++ )
      {
        if ( ft_strcmp( desc->serv_id, service_id ) == 0 )
        {
          result = (FT_Pointer)desc->serv_data;
          break;
        }
      }
    }

    return result;
  }